

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# presagearchive.c
# Opt level: O0

void PresageArchive_Close(PresageArchive *archive)

{
  int local_14;
  int i;
  PresageArchive *archive_local;
  
  if (archive != (PresageArchive *)0x0) {
    if (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
      PRDPRS_Close((archive->archive).prdprs);
    }
    else if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
      PRX_Close((archive->archive).prx);
    }
    for (local_14 = 0; local_14 < (int)(uint)archive->n_entries; local_14 = local_14 + 1) {
      PresageArchiveMember_Free(archive->members[local_14]);
    }
    free(archive);
  }
  return;
}

Assistant:

void
PresageArchive_Close(PresageArchive *archive)
{
	if (!archive) return;

	switch (archive->kind) {
	case PRESAGE_ARCHIVE_KIND_PRDPRS:
		PRDPRS_Close(archive->archive.prdprs);
		break;
	case PRESAGE_ARCHIVE_KIND_PRX:
		PRX_Close(archive->archive.prx);
		break;
	}

	for (int i = 0; i < archive->n_entries; i++) {
		PresageArchiveMember_Free(archive->members[i]);
	}

	free(archive);
}